

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

void __thiscall
QSideBarDelegate::initStyleOption
          (QSideBarDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  bool bVar1;
  QVariant *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  int arole;
  long in_FS_OFFSET;
  QStyledItemDelegate *unaff_retaddr;
  QVariant value;
  QModelIndex *in_stack_fffffffffffffff0;
  QStyleOptionViewItem *option_00;
  
  arole = (int)((ulong)in_RDI >> 0x20);
  option_00 = *(QStyleOptionViewItem **)(in_FS_OFFSET + 0x28);
  QStyledItemDelegate::initStyleOption(unaff_retaddr,option_00,in_stack_fffffffffffffff0);
  QModelIndex::data((QModelIndex *)&DAT_aaaaaaaaaaaaaaaa,arole);
  bVar1 = ::QVariant::isValid(in_RDX);
  if ((bVar1) && (bVar1 = qvariant_cast<bool>(in_RDX), !bVar1)) {
    QFlags<QStyle::StateFlag>::operator&=((QFlags<QStyle::StateFlag> *)(in_RSI + 8),-2);
  }
  ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
  if (*(QStyleOptionViewItem **)(in_FS_OFFSET + 0x28) != option_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSideBarDelegate::initStyleOption(QStyleOptionViewItem *option,
                                         const QModelIndex &index) const
{
    QStyledItemDelegate::initStyleOption(option,index);
    QVariant value = index.data(QUrlModel::EnabledRole);
    if (value.isValid()) {
        //If the bookmark/entry is not enabled then we paint it in gray
        if (!qvariant_cast<bool>(value))
            option->state &= ~QStyle::State_Enabled;
    }
}